

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::Branch::Branch
          (Branch *this,RaceSuccessfulPromiseNodeBase *parent,OwnPromiseNode dependencyParam,
          SourceLocation location)

{
  PromiseNode *pPVar1;
  
  Event::Event(&this->super_Event,location);
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_00597008;
  this->parent = parent;
  (this->promise).ptr =
       (PromiseNode *)((dependencyParam.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember;
  ((dependencyParam.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)0x0;
  pPVar1 = (this->promise).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar1,&this->promise);
  pPVar1 = (this->promise).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,this);
  return;
}

Assistant:

RaceSuccessfulPromiseNodeBase::Branch::Branch(
    RaceSuccessfulPromiseNodeBase &parent, OwnPromiseNode dependencyParam,
    SourceLocation location)
    : Event(location), parent(parent), promise(kj::mv(dependencyParam)) {
  promise->setSelfPointer(&promise);
  promise->onReady(this);
}